

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O1

int mk_utils_utime2gmt(char **data,time_t date)

{
  undefined8 *puVar1;
  long *plVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  void *pvVar7;
  time_t tVar8;
  long lVar9;
  int local_14;
  
  if (date == 0) {
    tVar8 = time((time_t *)0x0);
    if (tVar8 == -1) {
      return -1;
    }
  }
  else {
    pvVar7 = pthread_getspecific(mk_tls_cache_gmtext);
    if (pvVar7 != (void *)0x0) {
      lVar9 = 0;
      do {
        if (*(long *)((long)pvVar7 + lVar9) == date) {
          pcVar3 = *data;
          puVar1 = (undefined8 *)((long)pvVar7 + lVar9 + 8);
          uVar4 = *puVar1;
          uVar5 = puVar1[1];
          puVar1 = (undefined8 *)((long)pvVar7 + lVar9 + 0x18);
          uVar6 = puVar1[1];
          *(undefined8 *)(pcVar3 + 0x10) = *puVar1;
          *(undefined8 *)(pcVar3 + 0x18) = uVar6;
          *(undefined8 *)pcVar3 = uVar4;
          *(undefined8 *)(pcVar3 + 8) = uVar5;
          plVar2 = (long *)((long)pvVar7 + lVar9 + 0x28);
          *plVar2 = *plVar2 + 1;
          return 0x1f;
        }
        lVar9 = lVar9 + 0x30;
      } while (lVar9 != 0x1e0);
    }
  }
  mk_utils_utime2gmt_cold_1();
  return local_14;
}

Assistant:

int mk_utils_utime2gmt(char **data, time_t date)
{
    const int size = 31;
    unsigned short year, mday, hour, min, sec;
    char *buf=0;
    struct tm *gtm;

    if (date == 0) {
        if ((date = time(NULL)) == -1) {
            return -1;
        }
    }
    else {
        /* Maybe it's converted already? */
        if (mk_utils_gmt_cache_get(data, date) == MK_TRUE) {
            return size;
        }
    }

    /* Convert unix time to struct tm */
    gtm = MK_TLS_GET(mk_tls_cache_gmtime);

    /* If this function was invoked from a non-thread context it should exit */
    mk_bug(!gtm);
    gtm = gmtime_r(&date, gtm);
    if (!gtm) {
        return -1;
    }

    /* struct tm -> tm_year counts number of years after 1900 */
    year = gtm->tm_year + 1900;

    /* Signed division is slow, by using unsigned we gain 25% speed */
    mday = gtm->tm_mday;
    hour = gtm->tm_hour;
    min = gtm->tm_min;
    sec = gtm->tm_sec;

    /* Compose template */
    buf = *data;

    /* Week day */
    memcpy(buf, mk_date_wd[gtm->tm_wday], 5);
    buf += 5;

    /* Day of the month */
    *buf++ = ('0' + (mday / 10));
    *buf++ = ('0' + (mday % 10));
    *buf++ = ' ';

    /* Month */
    memcpy(buf, mk_date_ym[gtm->tm_mon], 4);
    buf += 4;

    /* Year */
    *buf++ = ('0' + (year / 1000) % 10);
    *buf++ = ('0' + (year / 100) % 10);
    *buf++ = ('0' + (year / 10) % 10);
    *buf++ = ('0' + (year % 10));
    *buf++ = ' ';

    /* Hour */
    *buf++ = ('0' + (hour / 10));
    *buf++ = ('0' + (hour % 10));
    *buf++ = ':';

    /* Minutes */
    *buf++ = ('0' + (min / 10));
    *buf++ = ('0' + (min % 10));
    *buf++ = ':';

    /* Seconds */
    *buf++ = ('0' + (sec / 10));
    *buf++ = ('0' + (sec % 10));

    /* GMT Time zone + CRLF */
    memcpy(buf, " GMT\r\n\0", 7);

    /* Add new entry to the cache */
    mk_utils_gmt_cache_add(*data, date);

    /* Set mk_ptr_t data len */
    return size;
}